

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

QString * __thiscall
MakefileGenerator::mkdir_p_asstring
          (QString *__return_storage_ptr__,MakefileGenerator *this,QString *dir,bool escape)

{
  QString string;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  QAnyStringView QVar1;
  QArrayData *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70 [16];
  QArrayData *local_80;
  char16_t *local_78;
  qsizetype local_70;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QStringBuilder<const_char_(&)[2],_QString> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000009,escape) == 0) {
    local_80 = &((dir->d).d)->super_QArrayData;
    local_78 = (dir->d).ptr;
    local_70 = (dir->d).size;
    if (local_80 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_80->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_80->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_50.a = (char (*) [2])(dir->d).d;
    local_50.b.d.d = (Data *)(dir->d).ptr;
    local_50.b.d.ptr = (char16_t *)(dir->d).size;
    if ((QArrayData *)local_50.a != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_50.a)->ref_)->ref_)._q_value.super___atomic_base<int>.
      _M_i = (((QArrayData *)&((QArrayData *)local_50.a)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    string.d._8_16_ = in_stack_ffffffffffffff70;
    string.d.d = (Data *)in_stack_ffffffffffffff68;
    Option::fixString((QString *)&stack0xffffffffffffff68,string,(uchar)&local_50);
    if ((QArrayData *)local_50.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)*local_50.a)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)*local_50.a)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)*local_50.a)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_50.a,2,0x10);
      }
    }
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
              (&local_80,this,&stack0xffffffffffffff68);
  }
  QVar1.m_size = (size_t)&this->makedir;
  QVar1.field_0.m_data = &local_68;
  QString::arg_impl(QVar1,(int)local_78,(QChar)(char16_t)local_70);
  local_50.b.d.size = local_58;
  local_50.b.d.ptr = pcStack_60;
  local_50.b.d.d = (Data *)local_68;
  local_50.a = (char (*) [2])0x2ad5a0;
  local_68 = (QArrayData *)0x0;
  pcStack_60 = (char16_t *)0x0;
  local_58 = 0;
  QStringBuilder<const_char_(&)[2],_QString>::convertTo<QString>(__return_storage_ptr__,&local_50);
  if (&(local_50.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.b.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  if (local_80 != (QArrayData *)0x0) {
    LOCK();
    (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_80,2,0x10);
    }
  }
  if ((escape) && (in_stack_ffffffffffffff68 != (QArrayData *)0x0)) {
    LOCK();
    (in_stack_ffffffffffffff68->ref_)._q_value.super___atomic_base<int>._M_i =
         (in_stack_ffffffffffffff68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((in_stack_ffffffffffffff68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(in_stack_ffffffffffffff68,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString MakefileGenerator::mkdir_p_asstring(const QString &dir, bool escape) const
{
    return "@" + makedir.arg(
        escape ? escapeFilePath(Option::fixPathToTargetOS(dir, false, false)) : dir);
}